

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

span<const_long> __thiscall libtorrent::session_stats_alert::counters(session_stats_alert *this)

{
  session_stats_alert *this_local;
  
  span<long_const>::span<std::array<long,299ul>,long,void>
            ((span<long_const> *)&this_local,&this->values);
  return _this_local;
}

Assistant:

span<std::int64_t const> session_stats_alert::counters() const
	{
#if TORRENT_ABI_VERSION == 1
		return values;
#else
		return { align_pointer<std::int64_t const>(m_alloc.get().ptr(m_counters_idx))
			, counters::num_counters };
#endif
	}